

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O1

iterator __thiscall
QHash<QWidget*,QRect>::emplace_helper<QRect_const&>
          (QHash<QWidget*,QRect> *this,QWidget **key,QRect *args)

{
  uchar *puVar1;
  byte bVar2;
  Entry *pEVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  piter pVar7;
  long in_FS_OFFSET;
  undefined1 local_38 [24];
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  local_38._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_38._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_38._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  QHashPrivate::Data<QHashPrivate::Node<QWidget*,QRect>>::findOrInsert<QWidget*>
            ((InsertionResult *)local_38,*(Data<QHashPrivate::Node<QWidget*,QRect>> **)this,key);
  pEVar3 = (*(Span **)(local_38._0_8_ + 0x20))[(ulong)local_38._8_8_ >> 7].entries;
  bVar2 = (*(Span **)(local_38._0_8_ + 0x20))[(ulong)local_38._8_8_ >> 7].offsets
          [(uint)local_38._8_8_ & 0x7f];
  if (local_38[0x10] == false) {
    *(QWidget **)pEVar3[bVar2].storage.data = *key;
  }
  iVar4 = (args->y1).m_i;
  iVar5 = (args->x2).m_i;
  iVar6 = (args->y2).m_i;
  puVar1 = pEVar3[bVar2].storage.data + 8;
  *(int *)puVar1 = (args->x1).m_i;
  *(int *)(puVar1 + 4) = iVar4;
  *(int *)(puVar1 + 8) = iVar5;
  *(int *)(puVar1 + 0xc) = iVar6;
  pVar7.bucket = local_38._8_8_;
  pVar7.d = (Data<QHashPrivate::Node<QWidget_*,_QRect>_> *)local_38._0_8_;
  if (*(long *)(in_FS_OFFSET + 0x28) != local_20) {
    __stack_chk_fail();
  }
  return (iterator)pVar7;
}

Assistant:

iterator emplace_helper(Key &&key, Args &&... args)
    {
        auto result = d->findOrInsert(key);
        if (!result.initialized)
            Node::createInPlace(result.it.node(), std::move(key), std::forward<Args>(args)...);
        else
            result.it.node()->emplaceValue(std::forward<Args>(args)...);
        return iterator(result.it);
    }